

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

void ddPatchTree(DdManager *dd,MtrNode *treenode)

{
  for (; treenode != (MtrNode *)0x0; treenode = treenode->younger) {
    treenode->low = dd->perm[treenode->index];
    if (treenode->child != (MtrNode *)0x0) {
      ddPatchTree(dd,treenode->child);
    }
  }
  return;
}

Assistant:

static void
ddPatchTree(
  DdManager *dd,
  MtrNode *treenode)
{
    MtrNode *auxnode = treenode;

    while (auxnode != NULL) {
        auxnode->low = dd->perm[auxnode->index];
        if (auxnode->child != NULL) {
            ddPatchTree(dd, auxnode->child);
        }
        auxnode = auxnode->younger;
    }

    return;

}